

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::verifySubroutineUniformValues
          (FunctionalTest16 *this,_test_case *test_case,uint *n_id,
          _subroutine_uniform_value_verification *verification)

{
  _shader_stage *current_stage;
  uint n_stage;
  uint n_stages;
  _shader_stage *stages [5];
  _subroutine_uniform_value_verification *verification_local;
  uint *n_id_local;
  _test_case *test_case_local;
  FunctionalTest16 *this_local;
  
  memset(&n_stage,0,0x28);
  getShaderStages(this,*test_case == TEST_CASE_FIRST,n_id,(_shader_stage **)&n_stage);
  for (current_stage._0_4_ = 0; (uint)current_stage < 5;
      current_stage._0_4_ = (uint)current_stage + 1) {
    verifySubroutineUniformValuesForShaderStage
              (this,*(_shader_stage **)(&n_stage + (ulong)(uint)current_stage * 2),verification);
  }
  return;
}

Assistant:

void FunctionalTest16::verifySubroutineUniformValues(const _test_case& test_case, const unsigned int& n_id,
													 const _subroutine_uniform_value_verification& verification)
{
	const _shader_stage* stages[] = {
		DE_NULL, /* fragment shader     stage slot */
		DE_NULL, /* geometry shader     stage slot */
		DE_NULL, /* tess control shader stage slot */
		DE_NULL, /* tess eval shader    stage slot */
		DE_NULL  /* vertex shader       stage slot */
	};
	const unsigned int n_stages = sizeof(stages) / sizeof(stages[0]);

	/* Verify that currently reported subroutine uniform values are equal to default values */
	getShaderStages(test_case == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT, n_id, stages);

	for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
	{
		const _shader_stage& current_stage = *(stages[n_stage]);

		verifySubroutineUniformValuesForShaderStage(current_stage, verification);
	} /* for (all items) */
}